

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

bool __thiscall
soplex::SPxSolverBase<double>::isTimeLimitReached(SPxSolverBase<double> *this,bool forceCheck)

{
  double dVar1;
  byte bVar2;
  double *pdVar3;
  byte in_SIL;
  undefined7 in_register_00000031;
  SPxSolverBase<double> *in_RDI;
  double extraout_XMM0_Qa;
  Real RVar4;
  Real avgtimeinterval;
  int nClckSkips;
  Real currtime;
  int local_24;
  
  bVar2 = in_SIL & 1;
  in_RDI->nCallsToTimelim = in_RDI->nCallsToTimelim + 1;
  dVar1 = in_RDI->maxTime;
  pdVar3 = (double *)infinity();
  if (dVar1 < *pdVar3) {
    if (((bVar2 == 0) && (199 < in_RDI->nCallsToTimelim)) && (0 < in_RDI->nClckSkipsLeft)) {
      in_RDI->nClckSkipsLeft = in_RDI->nClckSkipsLeft + -1;
    }
    else {
      time(in_RDI,(time_t *)CONCAT71(in_register_00000031,in_SIL));
      if (in_RDI->maxTime <= extraout_XMM0_Qa) {
        return true;
      }
      local_24 = 0x20;
      RVar4 = cumulativeTime(in_RDI);
      if (((in_RDI->maxTime - extraout_XMM0_Qa) * 0.01) /
          ((extraout_XMM0_Qa + RVar4) / (double)in_RDI->nCallsToTimelim + 1e-06) < 32.0) {
        local_24 = 0;
      }
      in_RDI->nClckSkipsLeft = local_24;
    }
  }
  return false;
}

Assistant:

bool SPxSolverBase<R>::isTimeLimitReached(const bool forceCheck)
   {
      // always update the number of calls, since the user might set a time limit later in the solving process
      ++nCallsToTimelim;

      // check if a time limit is actually set
      if(maxTime >= R(infinity))
         return false;

      // check if the expensive system call to update the time should be skipped again
      if(forceCheck || nCallsToTimelim < SOPLEX_NINITCALLS ||  nClckSkipsLeft <= 0)
      {
         Real currtime = time();

         if(currtime >= maxTime)
            return true;

         // determine the number of times the clock can be skipped again.
         int nClckSkips = SOPLEX_MAXNCLCKSKIPS;
         Real avgtimeinterval = (currtime + cumulativeTime()) / (Real)(nCallsToTimelim);

         // it would not be safe to skip the clock so many times since we are approaching the time limit
         if(SOPLEX_SAFETYFACTOR * (maxTime - currtime) / (avgtimeinterval + 1e-6) < nClckSkips)
            nClckSkips = 0;

         nClckSkipsLeft = nClckSkips;
      }
      else
         --nClckSkipsLeft;

      return false;
   }